

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::factorize(SPxBasisBase<double> *this)

{
  SLinSolver<double> *pSVar1;
  uint uVar2;
  int iVar3;
  SPxStatus SVar4;
  SPxStatus SVar5;
  SVectorBase<double> **ppSVar6;
  undefined8 uVar7;
  SPxStatusException *this_00;
  SPxBasisBase<double> *in_RDI;
  double extraout_XMM0_Qa;
  string *in_stack_ffffffffffffff28;
  SPxInternalCodeException *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  allocator *paVar8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_ac;
  allocator local_61;
  string local_60 [35];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  SVar5 = (SPxStatus)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if ((in_RDI->matrixIsSetup & 1U) == 0) {
    (*in_RDI->_vptr_SPxBasisBase[5])(in_RDI,&in_RDI->thedesc);
  }
  in_RDI->updateCount = 0;
  pSVar1 = in_RDI->factor;
  ppSVar6 = DataArray<const_soplex::SVectorBase<double>_*>::get_ptr(&in_RDI->matrix);
  uVar2 = DataArray<const_soplex::SVectorBase<double>_*>::size(&in_RDI->matrix);
  iVar3 = (*pSVar1->_vptr_SLinSolver[5])(pSVar1,ppSVar6,(ulong)uVar2);
  if (iVar3 == 0) {
    SVar4 = status(in_RDI);
    if (SVar4 == SINGULAR) {
      setStatus((SPxBasisBase<double> *)
                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),SVar5);
    }
    in_RDI->factorized = true;
    (*in_RDI->factor->_vptr_SLinSolver[6])();
    in_RDI->minStab = extraout_XMM0_Qa;
    if (0.0001 < in_RDI->minStab) {
      in_RDI->minStab = in_RDI->minStab * 0.001;
    }
    if (1e-05 < in_RDI->minStab) {
      in_RDI->minStab = in_RDI->minStab * 0.01;
    }
    if (1e-06 < in_RDI->minStab) {
      in_RDI->minStab = in_RDI->minStab * 0.1;
    }
  }
  else {
    if (iVar3 != 2) {
      std::operator<<((ostream *)&std::cerr,"EBASIS08 error: unknown status of factorization.\n");
      in_RDI->factorized = false;
      local_3d = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_28,"XBASIS01 This should never happen.",&local_29);
      SPxInternalCodeException::SPxInternalCodeException
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_3d = 0;
      __cxa_throw(uVar7,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    setStatus((SPxBasisBase<double> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              SVar5);
    in_RDI->factorized = false;
  }
  iVar3 = (*in_RDI->factor->_vptr_SLinSolver[3])();
  in_RDI->lastMem = iVar3;
  if (in_RDI->nzCount < 1) {
    local_ac = 1;
  }
  else {
    local_ac = in_RDI->nzCount;
  }
  in_RDI->lastFill = (in_RDI->fillFactor * (double)in_RDI->lastMem) / (double)local_ac;
  if (in_RDI->nzCount < 1) {
    iVar3 = 1;
  }
  else {
    iVar3 = in_RDI->nzCount;
  }
  in_RDI->lastNzCount = (int)(in_RDI->nonzeroFactor * (double)iVar3);
  SVar5 = status(in_RDI);
  if (SVar5 != SINGULAR) {
    return;
  }
  this_00 = (SPxStatusException *)__cxa_allocate_exception(0x28);
  paVar8 = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Cannot factorize singular matrix",paVar8);
  SPxStatusException::SPxStatusException(this_00,in_stack_ffffffffffffff28);
  __cxa_throw(this_00,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
}

Assistant:

void SPxBasisBase<R>::factorize()
{

   assert(factor != nullptr);

   if(!matrixIsSetup)
      loadDesc(thedesc);

   assert(matrixIsSetup);

   updateCount = 0;

   switch(factor->load(matrix.get_ptr(), matrix.size()))
   {
   case SLinSolver<R>::OK :
      if(status() == SINGULAR)
         setStatus(REGULAR);

      factorized = true;
      minStab = factor->stability();

      // This seems always to be about 1e-7
      if(minStab > 1e-4)
         minStab *= 0.001;

      if(minStab > 1e-5)
         minStab *= 0.01;

      if(minStab > 1e-6)
         minStab *= 0.1;

      break;

   case SLinSolver<R>::SINGULAR :
      setStatus(SINGULAR);
      factorized = false;
      break;

   default :
      SPX_MSG_ERROR(std::cerr << "EBASIS08 error: unknown status of factorization.\n";)
      factorized = false;
      throw SPxInternalCodeException("XBASIS01 This should never happen.");
   }

   // get nonzero count of factorization
   lastMem    = factor->memory();
   // compute fill ratio between factorization and basis matrix (multiplied with tolerance)
   lastFill   = fillFactor * R(lastMem) / R(nzCount > 0 ? nzCount : 1);
   lastNzCount = int(nonzeroFactor * R(nzCount > 0 ? nzCount : 1));

   if(status() == SINGULAR)
   {
      throw SPxStatusException("Cannot factorize singular matrix");
   }
}